

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

int MAFSA_automaton_str_to_int_pair(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  do {
    uVar3 = sz_l;
    if (uVar4 - sz_l == -1) break;
    uVar3 = uVar4 + 1;
    lVar1 = uVar4 + 1;
    uVar4 = uVar3;
  } while (l[lVar1] != delim);
  iVar2 = MAFSA_automaton_val_to_int_pair(l + uVar3 + 1,~uVar3 + sz_l,delim,out);
  return iVar2;
}

Assistant:

extern int MAFSA_automaton_str_to_int_pair(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int_pair(l + i + 1,
        sz_l - i - 1, delim, out);
}